

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O0

void __thiscall helics::apps::Probe::runTo(Probe *this,Time stopTime_input)

{
  bool bVar1;
  element_type *peVar2;
  long *in_RDI;
  Time currentTime;
  Modes currentMode;
  IterationRequest in_stack_00000057;
  Federate *in_stack_00000058;
  Probe *in_stack_000000e8;
  Federate *in_stack_ffffffffffffffc8;
  TimeRepresentation<count_time<9,_long>_> local_20;
  Modes local_11;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x25f0a1);
  local_11 = Federate::getCurrentMode((Federate *)0x25f0b0);
  if (local_11 == STARTUP) {
    (**(code **)(*in_RDI + 0x10))();
  }
  if ((char)local_11 < '\x02') {
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x25f0db);
    Federate::enterExecutingMode(in_stack_00000058,in_stack_00000057);
  }
  peVar2 = CLI::std::
           __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25f0fa);
  local_20.internalTimeCode =
       (baseType)
       Federate::getCurrentTime
                 ((Federate *)
                  ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]));
  while( true ) {
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=(&local_20,&local_8);
    if (!bVar1) break;
    runProbe(in_stack_000000e8);
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x25f13b);
    local_20.internalTimeCode = (baseType)Federate::requestNextStep(in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void Probe::runTo(Time stopTime_input)
{
    auto currentMode = fed->getCurrentMode();
    if (currentMode == Federate::Modes::STARTUP) {
        initialize();
    }

    if (currentMode < Federate::Modes::EXECUTING) {
        fed->enterExecutingMode();
    }

    Time currentTime = fed->getCurrentTime();

    while (currentTime <= stopTime_input) {
        runProbe();
        currentTime = fed->requestNextStep();
    }
}